

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primality-test-baseline.c
# Opt level: O0

int gaICtz(uint64_t n)

{
  undefined4 local_c;
  uint64_t n_local;
  
  if (n == 0) {
    local_c = 0x40;
  }
  else {
    local_c = 0;
    for (; (n & 1) == 0; n = n >> 1 | 0x8000000000000000) {
      local_c = local_c + 1;
    }
  }
  return local_c;
}

Assistant:

int      gaICtz       (uint64_t n){
#if __GNUC__ >= 4
	return n ? __builtin_ctzll(n) : 64;
#else
	int z;

	for(z=0;z<64;z++){
		if((n>>z) & 1){break;}
	}

	return z;
#endif
}